

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int nargc;
  lfd local_func_data;
  int flag2;
  int flag;
  int bool_type;
  long long_int;
  char *str;
  zt_opt_def_t local_188;
  undefined1 local_158;
  char *local_150;
  char *local_148;
  code *local_140;
  int *local_138;
  char *local_130;
  undefined1 local_128;
  char *local_120;
  char *local_118;
  code *local_110;
  char **local_108;
  char *local_100;
  undefined1 local_f8;
  char *local_f0;
  char *local_e8;
  code *local_e0;
  lfd *local_d8;
  char *local_d0;
  undefined1 local_c8;
  char *local_c0;
  char *local_b8;
  code *local_b0;
  long *local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  code *local_80;
  int *local_78;
  char *local_70;
  undefined1 local_68;
  char *local_60;
  undefined8 local_58;
  code *local_50;
  int *local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_138 = &bool_type;
  bool_type = 0;
  local_108 = &str;
  str = (char *)0x0;
  local_a8 = &long_int;
  long_int = 0;
  local_78 = &flag;
  flag = 0;
  local_48 = &flag2;
  flag2 = 0;
  local_d8 = &local_func_data;
  local_func_data.data = 0;
  local_188.sopt = 'h';
  local_188.lopt = "help";
  local_188.arg = (char *)0x0;
  local_188.cb = zt_opt_help_stdout;
  local_188.cb_data = "[options]";
  local_188.help = "this help text";
  local_158 = 0x62;
  local_150 = "bool";
  local_148 = "[true|false]";
  local_140 = zt_opt_bool_int;
  local_130 = "boolean test";
  local_128 = 0x73;
  local_120 = "string";
  local_118 = "text";
  local_110 = zt_opt_string;
  local_100 = 
  "This is a really long string intended to overflow the wrap widths so that we can test how well they work.  This is only a test"
  ;
  local_f8 = 0x66;
  local_f0 = "func";
  local_e8 = "arg";
  local_e0 = local_func_with_args;
  local_d0 = "generic function";
  local_c8 = 0x6c;
  local_c0 = "long";
  local_b8 = "int";
  local_b0 = zt_opt_long;
  local_a0 = "a long integer";
  local_98 = 0x71;
  local_90 = 0;
  uStack_88 = 0;
  local_80 = zt_opt_flag_int;
  local_70 = "short only flag";
  local_68 = 0xff;
  local_60 = "quiet";
  local_58 = 0;
  local_50 = zt_opt_flag_int;
  local_40 = "long only flag";
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  nargc = argc;
  iVar1 = zt_opt_process_args(&nargc,argv,&local_188,(zt_opt_validate)0x0,(zt_opt_error)0x0);
  if (-1 < iVar1) {
    return 0;
  }
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"Error processing args");
  exit(1);
}

Assistant:

int
main(int argc, char ** argv) {
    int        bool_type        = 0;
    char     * str              = NULL;
    long       long_int         = 0;
    int        flag             = 0;
    int        flag2            = 0;
    struct lfd local_func_data  = {
        0
    };

    #define LONG_DESC "This is a really long string intended to overflow the wrap widths so that we can test how well they work.  This is only a test"
    struct zt_opt_def options[] = {
        { 'h',        "help",     NULL,           zt_opt_help_stdout,   "[options]",      "this help text"   },
        { 'b',        "bool",     "[true|false]", zt_opt_bool_int,      &bool_type,       "boolean test"     },
        { 's',        "string",   "text",         zt_opt_string,        &str,             LONG_DESC          },
        { 'f',        "func",     "arg",          local_func_with_args, &local_func_data, "generic function" },
        { 'l',        "long",     "int",          zt_opt_long,          &long_int,        "a long integer"   },
        { 'q',        ZT_OPT_NLO, NULL,           zt_opt_flag_int,      &flag,            "short only flag"  },
        { ZT_OPT_NSO, "quiet",    NULL,           zt_opt_flag_int,      &flag2,           "long only flag"   },
        { ZT_OPT_END() }
    };

    int               nargc = argc;
    char           ** pargv = argv;

    int               ret   = zt_opt_process_args(&nargc, pargv, options, NULL, NULL);
    if (ret < 0) {
        zt_log_printf(zt_log_err, "Error processing args");
        exit(1);
    }

    return 0;
}